

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O1

fixup_entry * sort_dir_list(fixup_entry *p)

{
  fixup_entry *pfVar1;
  int iVar2;
  fixup_entry *pfVar3;
  fixup_entry *pfVar4;
  fixup_entry *pfVar5;
  
  if (p == (fixup_entry *)0x0) {
    p = (fixup_entry *)0x0;
  }
  else if (p->next != (fixup_entry *)0x0) {
    pfVar4 = p->next->next;
    pfVar3 = p;
    while (pfVar4 != (fixup_entry *)0x0) {
      if (pfVar4->next == (fixup_entry *)0x0) {
        pfVar4 = (fixup_entry *)0x0;
      }
      else {
        pfVar4 = pfVar4->next->next;
      }
      pfVar3 = pfVar3->next;
    }
    pfVar4 = pfVar3->next;
    pfVar3->next = (fixup_entry *)0x0;
    pfVar3 = sort_dir_list(p);
    p = sort_dir_list(pfVar4);
    iVar2 = strcmp(pfVar3->name,p->name);
    if (iVar2 < 1) {
      pfVar5 = p->next;
      pfVar1 = p;
      pfVar4 = pfVar3;
    }
    else {
      pfVar1 = pfVar3;
      pfVar5 = p;
      pfVar4 = pfVar3->next;
      p = pfVar3;
    }
    while( true ) {
      if ((pfVar4 == (fixup_entry *)0x0) || (pfVar5 == (fixup_entry *)0x0)) break;
      iVar2 = strcmp(pfVar4->name,pfVar5->name);
      if (iVar2 < 1) {
        pfVar1->next = pfVar5;
        pfVar5 = pfVar5->next;
      }
      else {
        pfVar1->next = pfVar4;
        pfVar4 = pfVar4->next;
      }
      pfVar1 = pfVar1->next;
    }
    if ((pfVar4 != (fixup_entry *)0x0) || (pfVar5 != (fixup_entry *)0x0)) {
      if (pfVar5 != (fixup_entry *)0x0) {
        pfVar4 = pfVar5;
      }
      pfVar1->next = pfVar4;
    }
  }
  return p;
}

Assistant:

static struct fixup_entry *
sort_dir_list(struct fixup_entry *p)
{
	struct fixup_entry *a, *b, *t;

	if (p == NULL)
		return (NULL);
	/* A one-item list is already sorted. */
	if (p->next == NULL)
		return (p);

	/* Step 1: split the list. */
	t = p;
	a = p->next->next;
	while (a != NULL) {
		/* Step a twice, t once. */
		a = a->next;
		if (a != NULL)
			a = a->next;
		t = t->next;
	}
	/* Now, t is at the mid-point, so break the list here. */
	b = t->next;
	t->next = NULL;
	a = p;

	/* Step 2: Recursively sort the two sub-lists. */
	a = sort_dir_list(a);
	b = sort_dir_list(b);

	/* Step 3: Merge the returned lists. */
	/* Pick the first element for the merged list. */
	if (strcmp(a->name, b->name) > 0) {
		t = p = a;
		a = a->next;
	} else {
		t = p = b;
		b = b->next;
	}

	/* Always put the later element on the list first. */
	while (a != NULL && b != NULL) {
		if (strcmp(a->name, b->name) > 0) {
			t->next = a;
			a = a->next;
		} else {
			t->next = b;
			b = b->next;
		}
		t = t->next;
	}

	/* Only one list is non-empty, so just splice it on. */
	if (a != NULL)
		t->next = a;
	if (b != NULL)
		t->next = b;

	return (p);
}